

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_flbi.c
# Opt level: O0

char * cmime_flbi_get_boundary(char *s)

{
  char *pcVar1;
  size_t sVar2;
  char *stripped;
  int pos;
  char *p;
  char *boundary;
  char *t;
  char *s_local;
  
  boundary = (char *)0x0;
  stripped._4_4_ = 0;
  pcVar1 = strcasestr(s,"boundary=");
  if (pcVar1 != (char *)0x0) {
    pcVar1 = strstr(pcVar1,"=");
    t = pcVar1 + 1;
    if (pcVar1[1] == '\"') {
      t = pcVar1 + 2;
    }
    sVar2 = strlen(t);
    boundary = (char *)calloc(sVar2 + 1,1);
    for (; *t != '\0'; t = t + 1) {
      if ((*t == ';') || (*t == '\"')) {
        boundary[stripped._4_4_] = '\0';
        break;
      }
      boundary[stripped._4_4_] = *t;
      stripped._4_4_ = stripped._4_4_ + 1;
    }
  }
  if (boundary == (char *)0x0) {
    p = boundary;
  }
  else {
    p = cmime_string_strip(boundary);
    if (p != boundary) {
      p = strdup(p);
      free(boundary);
    }
  }
  return p;
}

Assistant:

char *cmime_flbi_get_boundary(char *s) {
    char *t = NULL;
    char *boundary = NULL;  
    char *p = NULL;
    int pos = 0;

    p = strcasestr(s,"boundary=");
    if (p != NULL) {
        s = strstr(p,"=");
        if (*++s=='"') 
            s++;
                
        t = (char *)calloc(strlen(s) + sizeof(char),sizeof(char));
        while(*s!='\0') {
            if ((*s!=';') && (*s!='"'))
                t[pos++] = *s;
            else {
                t[pos] = '\0';
                break;
            }
            s++;
        }
    }

    if (t != NULL) {
        char *stripped = cmime_string_strip(t);
        if (stripped != t) {
            boundary = strdup(stripped);
            free(t);
        } else
            boundary = stripped;
    } else
        boundary = t;

    return boundary;
}